

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_video.cpp
# Opt level: O0

int V_GetColor(DWORD *palette,char *str)

{
  bool bVar1;
  char *cstr;
  int local_24;
  int res;
  FString string;
  char *str_local;
  DWORD *palette_local;
  
  string.Chars = str;
  V_GetColorStringByName((char *)&stack0xffffffffffffffe0);
  bVar1 = FString::IsEmpty((FString *)&stack0xffffffffffffffe0);
  if (bVar1) {
    local_24 = V_GetColorFromString(palette,string.Chars);
  }
  else {
    cstr = FString::operator_cast_to_char_((FString *)&stack0xffffffffffffffe0);
    local_24 = V_GetColorFromString(palette,cstr);
  }
  FString::~FString((FString *)&stack0xffffffffffffffe0);
  return local_24;
}

Assistant:

int V_GetColor (const DWORD *palette, const char *str)
{
	FString string = V_GetColorStringByName (str);
	int res;

	if (!string.IsEmpty())
	{
		res = V_GetColorFromString (palette, string);
	}
	else
	{
		res = V_GetColorFromString (palette, str);
	}
	return res;
}